

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrecord.cpp
# Opt level: O2

void __thiscall QSqlRecord::insert(QSqlRecord *this,int pos,QSqlField *field)

{
  QExplicitlySharedDataPointer<QSqlRecordPrivate>::detach(&this->d);
  QList<QSqlField>::emplace<QSqlField_const&>(&((this->d).d.ptr)->fields,(long)pos,field);
  return;
}

Assistant:

void QSqlRecord::insert(int pos, const QSqlField &field)
{
   detach();
   d->fields.insert(pos, field);
}